

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

bool __thiscall mkvmuxer::Track::SetCodecPrivate(Track *this,uint8_t *codec_private,uint64_t length)

{
  uint8_t *__dest;
  
  if (length != 0 && codec_private != (uint8_t *)0x0) {
    if (this->codec_private_ != (uint8_t *)0x0) {
      operator_delete__(this->codec_private_);
    }
    __dest = (uint8_t *)operator_new__(length,(nothrow_t *)&std::nothrow);
    this->codec_private_ = __dest;
    if (__dest != (uint8_t *)0x0) {
      memcpy(__dest,codec_private,length);
      this->codec_private_length_ = length;
    }
    return __dest != (uint8_t *)0x0;
  }
  return false;
}

Assistant:

bool Track::SetCodecPrivate(const uint8_t* codec_private, uint64_t length) {
  if (!codec_private || length < 1)
    return false;

  delete[] codec_private_;

  codec_private_ =
      new (std::nothrow) uint8_t[static_cast<size_t>(length)];  // NOLINT
  if (!codec_private_)
    return false;

  memcpy(codec_private_, codec_private, static_cast<size_t>(length));
  codec_private_length_ = length;

  return true;
}